

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_periodic_boundary_conditions_base.h
# Opt level: O0

void __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>::
impose_lower_star_filtration_from_vertices
          (Bitmap_cubical_complex_periodic_boundary_conditions_base<double> *this)

{
  double dVar1;
  value_type vVar2;
  bool bVar3;
  size_type sVar4;
  reference puVar5;
  reference pvVar6;
  reference rVar7;
  reference local_160;
  reference local_150;
  size_type local_140;
  unsigned_long coboundary;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cbd;
  unsigned_long index;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_indices_to_consider;
  size_t local_b0;
  Vertices_iterator local_a8;
  undefined1 local_88 [8];
  Vertices_iterator it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices_to_consider;
  allocator<bool> local_3a;
  bool local_39;
  undefined1 local_38 [8];
  vector<bool,_std::allocator<bool>_> is_this_cell_considered;
  Bitmap_cubical_complex_periodic_boundary_conditions_base<double> *this_local;
  
  is_this_cell_considered.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)this;
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    (&(this->super_Bitmap_cubical_complex_base<double>).data);
  local_39 = false;
  std::allocator<bool>::allocator(&local_3a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_38,sVar4,&local_39,&local_3a);
  std::allocator<bool>::~allocator(&local_3a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&it.b);
  vertices_iterator_begin((Vertices_iterator *)local_88,this);
  while( true ) {
    vertices_iterator_end(&local_a8,this);
    bVar3 = Vertices_iterator::operator!=((Vertices_iterator *)local_88,&local_a8);
    Vertices_iterator::~Vertices_iterator(&local_a8);
    if (!bVar3) break;
    local_b0 = Vertices_iterator::compute_index_in_bitmap((Vertices_iterator *)local_88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&it.b,&local_b0);
    Vertices_iterator::operator++
              ((Vertices_iterator *)
               &new_indices_to_consider.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Vertices_iterator *)local_88);
    Vertices_iterator::~Vertices_iterator
              ((Vertices_iterator *)
               &new_indices_to_consider.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  Vertices_iterator::~Vertices_iterator((Vertices_iterator *)local_88);
  while( true ) {
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&it.b);
    if (sVar4 == 0) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
    __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&it.b);
    index = (unsigned_long)
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&it.b);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)&index);
      if (!bVar3) break;
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end3);
      cbd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar5;
      (*(this->super_Bitmap_cubical_complex_base<double>)._vptr_Bitmap_cubical_complex_base[3])
                (&__range4,this,
                 cbd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      __end4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
      coboundary = (unsigned_long)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end4,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)&coboundary);
        if (!bVar3) break;
        puVar5 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end4);
        local_140 = *puVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(this->super_Bitmap_cubical_complex_base<double>).data,local_140);
        dVar1 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(this->super_Bitmap_cubical_complex_base<double>).data,
                            (size_type)
                            cbd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (dVar1 < *pvVar6) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(this->super_Bitmap_cubical_complex_base<double>).data,
                              (size_type)
                              cbd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          vVar2 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(this->super_Bitmap_cubical_complex_base<double>).data,local_140);
          *pvVar6 = vVar2;
        }
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_38,local_140);
        local_150 = rVar7;
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_150);
        if (!bVar3) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3,&local_140);
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_38,local_140);
          local_160 = rVar7;
          std::_Bit_reference::operator=(&local_160,true);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end4);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end3);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::swap
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&it.b,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&it.b);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_38)
  ;
  return;
}

Assistant:

void Bitmap_cubical_complex_periodic_boundary_conditions_base<T>::impose_lower_star_filtration_from_vertices() {
  // this vector will be used to check which elements have already been taken care of in imposing lower star filtration
  std::vector<bool> is_this_cell_considered(this->data.size(), false);

  std::vector<std::size_t> indices_to_consider;
  // we assume here that we already have a filtration on the vertices and
  // we have to extend it to higher ones.
  for (auto it = this->vertices_iterator_begin();
       it != this->vertices_iterator_end(); ++it) {
    indices_to_consider.push_back(it.compute_index_in_bitmap());
  }

  while (indices_to_consider.size()) { // Iteration on the dimension
#ifdef DEBUG_TRACES
    std::clog << "indices_to_consider in this iteration \n";
    for (auto index : indices_to_consider) {
      std::clog << index << "  ";
    }
#endif
    std::vector<std::size_t> new_indices_to_consider;
    for (auto index : indices_to_consider) {
      std::vector<std::size_t> cbd = this->get_coboundary_of_a_cell(index);
      for (auto coboundary : cbd) {
#ifdef DEBUG_TRACES
        std::clog << "filtration of a cell : " << coboundary << " is : " << this->data[coboundary]
                  << " while of a cell: " << index << " is: " << this->data[index]
                  << std::endl;
#endif
        if (this->data[coboundary] < this->data[index]) {
          this->data[coboundary] = this->data[index];
#ifdef DEBUG_TRACES
          std::clog << "Setting the value of a cell : " << coboundary
                    << " to : " << this->data[index] << std::endl;
#endif
        }
        if (is_this_cell_considered[coboundary] == false) {
          new_indices_to_consider.push_back(coboundary);
          is_this_cell_considered[coboundary] = true;
        }
      }
    }
    indices_to_consider.swap(new_indices_to_consider);
  }
}